

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void av1_highbd_inv_txfm_add_sse4_1
               (tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  undefined1 (*pauVar1) [16];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  char *pcVar6;
  code *pcVar7;
  code *pcVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  uint uVar20;
  undefined1 (*pauVar21) [16];
  tran_low_t *ptVar22;
  undefined1 (*pauVar23) [16];
  TX_TYPE tx_type;
  ulong uVar24;
  undefined8 *puVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  int *piVar30;
  undefined8 *puVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  undefined1 (*pauVar36) [16];
  ulong uVar37;
  long lVar38;
  bool bVar39;
  short sVar40;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  __m128i round;
  undefined1 auVar41 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar42 [16];
  short sVar49;
  undefined1 in_XMM1 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ushort uVar52;
  int iVar54;
  ushort uVar64;
  ushort uVar65;
  int iVar66;
  ushort uVar67;
  ushort uVar68;
  int iVar69;
  ushort uVar70;
  ushort uVar71;
  undefined1 in_XMM2 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  short sVar73;
  undefined1 auVar59 [16];
  int iVar72;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ushort uVar74;
  int iVar75;
  int iVar79;
  int iVar81;
  undefined1 in_XMM3 [16];
  undefined1 auVar76 [16];
  int iVar82;
  undefined1 auVar77 [16];
  int iVar80;
  undefined1 auVar78 [16];
  undefined1 auVar83 [16];
  __m128i buf1 [16];
  byte local_250;
  byte local_248;
  undefined8 local_238;
  int aiStack_230 [2];
  undefined4 local_228 [12];
  undefined1 local_1f8 [16];
  undefined4 local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined1 local_1c8 [144];
  int local_138 [2];
  undefined8 uStack_130;
  undefined8 uStack_120;
  undefined4 local_118 [2];
  undefined8 uStack_110;
  undefined8 uStack_100;
  undefined4 local_f8 [2];
  undefined8 uStack_f0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  short sVar53;
  
  bVar2 = txfm_param->tx_size;
  uVar24 = (ulong)bVar2;
  switch(uVar24) {
  case 0:
    if (txfm_param->lossless == 0) {
      av1_inv_txfm2d_add_4x4_sse4_1
                (input,(uint16_t *)((long)dest * 2),stride,txfm_param->tx_type,txfm_param->bd);
      return;
    }
    av1_highbd_iwht4x4_add(input,dest,stride,txfm_param->eob,txfm_param->bd);
    return;
  case 1:
    iVar79 = txfm_param->bd;
    tx_type = txfm_param->tx_type;
    if (6 < (byte)(tx_type - 9)) {
      av1_inv_txfm2d_add_8x8_sse4_1(input,(uint16_t *)((long)dest * 2),stride,tx_type,iVar79);
      return;
    }
    iVar81 = txfm_param->eob;
    goto LAB_003fca2c;
  default:
    tx_type = txfm_param->tx_type;
    iVar79 = txfm_param->bd;
    iVar81 = txfm_param->eob;
LAB_003fca2c:
    av1_highbd_inv_txfm2d_add_universe_sse4_1(input,dest,stride,tx_type,bVar2,iVar81,iVar79);
    break;
  case 5:
    uVar27 = txfm_param->bd;
    bVar3 = txfm_param->tx_type;
    uVar29 = (ulong)bVar3;
    bVar39 = 0xf < uVar29;
    puVar31 = (undefined8 *)((long)dest * 2);
    pcVar6 = av1_inv_txfm_shift_ls[uVar24];
    uVar34 = (ulong)((uint)bVar2 * 4);
    uVar24 = (ulong)*(uint *)((long)tx_size_wide + uVar34);
    uVar26 = *(uint *)((long)tx_size_high + uVar34);
    uVar37 = (ulong)uVar26;
    pcVar7 = *(code **)((ulong)""[uVar29] * 0x20 +
                       (long)*(int *)((long)tx_size_wide_log2 + uVar34) * 0x60 + 0x5da8a0);
    uVar33 = 0x20;
    if ((int)uVar26 < 0x20) {
      uVar33 = uVar26;
    }
    uVar32 = 0xbeaf >> (bVar3 & 0x1f);
    pcVar8 = *(code **)((ulong)""[uVar29] * 0x20 +
                       (long)*(int *)((long)tx_size_high_log2 + uVar34) * 0x60 + 0x5da8a8);
    puVar25 = &local_238;
    ptVar22 = input;
    uVar29 = uVar24;
    do {
      uVar12 = *(undefined8 *)(ptVar22 + 2);
      *puVar25 = *(undefined8 *)ptVar22;
      puVar25[1] = uVar12;
      puVar25 = puVar25 + 2;
      ptVar22 = ptVar22 + (int)uVar33;
      uVar29 = uVar29 - 1;
    } while (uVar29 != 0);
    pauVar36 = (undefined1 (*) [16])(input + 4);
    pauVar23 = &local_1f8;
    pauVar21 = pauVar23;
    do {
      auVar59 = *pauVar36;
      *pauVar21 = auVar59;
      pauVar21 = pauVar21 + 1;
      pauVar36 = (undefined1 (*) [16])(*pauVar36 + (long)(int)uVar33 * 4);
      uVar24 = uVar24 - 1;
    } while (uVar24 != 0);
    pauVar21 = (undefined1 (*) [16])&local_238;
    auVar59 = pmovsxwd(auVar59,0xb500b500b500b50);
    auVar76 = pmovsxwd(in_XMM1,0x800080008000800);
    uVar24 = uVar37;
    do {
      auVar55 = pmulld(*pauVar21,auVar59);
      *(int *)*pauVar21 = auVar55._0_4_ + auVar76._0_4_ >> 0xc;
      *(int *)(*pauVar21 + 4) = auVar55._4_4_ + auVar76._4_4_ >> 0xc;
      *(int *)(*pauVar21 + 8) = auVar55._8_4_ + auVar76._8_4_ >> 0xc;
      *(int *)(*pauVar21 + 0xc) = auVar55._12_4_ + auVar76._12_4_ >> 0xc;
      pauVar21 = pauVar21 + 1;
      uVar24 = uVar24 - 1;
    } while (uVar24 != 0);
    (*pcVar7)(&local_238,&local_238,0xc,0,uVar27,-(int)*pcVar6);
    (*pcVar7)(pauVar23,pauVar23,0xc,0,uVar27,-(int)*pcVar6);
    if ((0x7f1fU >> (bVar3 & 0x1f) & 1) == 0 && !bVar39) {
      uStack_120._0_4_ = local_228[9];
      uStack_120._4_4_ = local_228[5];
      local_118[0] = local_228[10];
      local_118[1] = local_228[6];
      uStack_110._0_4_ = local_228[2];
      uStack_110._4_4_ = aiStack_230[0];
      uStack_100._0_4_ = local_228[0xb];
      uStack_100._4_4_ = local_228[7];
      auVar41._4_4_ = uStack_1d0;
      auVar41._0_4_ = local_1c8._8_4_;
      auVar41._8_4_ = local_1c8._12_4_;
      auVar41._12_4_ = uStack_1cc;
      local_1d8 = local_1e8;
      uStack_1d0 = uStack_1e0;
      uStack_1cc = uStack_1dc;
    }
    else {
      pauVar23 = (undefined1 (*) [16])local_1c8;
      uStack_120._0_4_ = local_238._4_4_;
      uStack_120._4_4_ = local_228[1];
      local_118[0] = aiStack_230[0];
      local_118[1] = local_228[2];
      uStack_110._0_4_ = local_228[6];
      uStack_110._4_4_ = local_228[10];
      uStack_100._0_4_ = aiStack_230[1];
      uStack_100._4_4_ = local_228[3];
      auVar41._4_4_ = uStack_1e0;
      auVar41._0_4_ = local_1f8._8_4_;
      auVar41._8_4_ = local_1f8._12_4_;
      auVar41._12_4_ = uStack_1dc;
    }
    uStack_f0 = CONCAT44(*(undefined4 *)*pauVar23,local_1d8);
    auVar56._0_8_ = CONCAT44(*(undefined4 *)(*pauVar23 + 8),uStack_1d0);
    auVar56._8_4_ = uStack_1cc;
    auVar56._12_4_ = *(undefined4 *)(*pauVar23 + 0xc);
    pauVar23 = (undefined1 (*) [16])local_138;
    local_d8 = auVar41._0_8_;
    local_c8 = auVar41._8_8_;
    uStack_c0 = auVar56._8_8_;
    uStack_d0 = auVar56._0_8_;
    (*pcVar8)(pauVar23,pauVar23,0xc,1,uVar27,0);
    bVar2 = pcVar6[1];
    uVar24 = uVar37;
    if ((char)bVar2 < '\0') {
      iVar79 = 1 << (~bVar2 & 0x1f);
      pauVar23 = (undefined1 (*) [16])local_138;
      auVar50 = ZEXT416((uint)-(int)(char)bVar2);
      do {
        auVar56._0_4_ = *(int *)*pauVar23 + iVar79 >> auVar50;
        auVar56._4_4_ = *(int *)((long)*pauVar23 + 4) + iVar79 >> auVar50;
        auVar56._8_4_ = *(int *)((long)*pauVar23 + 8) + iVar79 >> auVar50;
        auVar56._12_4_ = *(int *)((long)*pauVar23 + 0xc) + iVar79 >> auVar50;
        *pauVar23 = auVar56;
        pauVar23 = pauVar23 + 1;
        uVar24 = uVar24 - 1;
      } while (uVar24 != 0);
    }
    else {
      do {
        auVar50._0_4_ = *(int *)*pauVar23 << (int)(char)bVar2;
        auVar50._4_4_ = *(int *)((long)*pauVar23 + 4);
        auVar50._8_4_ = *(int *)((long)*pauVar23 + 8);
        auVar50._12_4_ = *(int *)((long)*pauVar23 + 0xc);
        *pauVar23 = auVar50;
        pauVar23 = pauVar23 + 1;
        uVar24 = uVar24 - 1;
      } while (uVar24 != 0);
    }
    auVar59 = pmovsxbw(auVar50,0x101010101010101);
    auVar59 = psllw(auVar59,ZEXT416(uVar27));
    sVar40 = auVar59._0_2_ + -1;
    sVar43 = auVar59._2_2_ + -1;
    sVar44 = auVar59._4_2_ + -1;
    sVar45 = auVar59._6_2_ + -1;
    sVar46 = auVar59._8_2_ + -1;
    sVar47 = auVar59._10_2_ + -1;
    sVar48 = auVar59._12_2_ + -1;
    sVar49 = auVar59._14_2_ + -1;
    lVar28 = 0;
    if ((uVar32 & 1) == 0 && !bVar39) {
      lVar28 = (long)(int)(uVar26 - 1);
    }
    piVar30 = local_138 + lVar28 * 4;
    do {
      auVar59 = pmovsxwd(auVar56,*puVar31);
      auVar58._0_4_ = auVar59._0_4_ + *piVar30;
      auVar58._4_4_ = auVar59._4_4_ + piVar30[1];
      auVar58._8_4_ = auVar59._8_4_ + piVar30[2];
      auVar58._12_4_ = auVar59._12_4_ + piVar30[3];
      auVar59 = packusdw(auVar58,auVar58);
      sVar53 = auVar59._0_2_;
      uVar52 = (ushort)(sVar40 < sVar53) * sVar40 | (ushort)(sVar40 >= sVar53) * sVar53;
      sVar53 = auVar59._2_2_;
      uVar64 = (ushort)(sVar43 < sVar53) * sVar43 | (ushort)(sVar43 >= sVar53) * sVar53;
      sVar53 = auVar59._4_2_;
      uVar65 = (ushort)(sVar44 < sVar53) * sVar44 | (ushort)(sVar44 >= sVar53) * sVar53;
      sVar53 = auVar59._6_2_;
      uVar67 = (ushort)(sVar45 < sVar53) * sVar45 | (ushort)(sVar45 >= sVar53) * sVar53;
      sVar53 = auVar59._8_2_;
      uVar68 = (ushort)(sVar46 < sVar53) * sVar46 | (ushort)(sVar46 >= sVar53) * sVar53;
      sVar53 = auVar59._10_2_;
      uVar70 = (ushort)(sVar47 < sVar53) * sVar47 | (ushort)(sVar47 >= sVar53) * sVar53;
      sVar53 = auVar59._12_2_;
      sVar73 = auVar59._14_2_;
      uVar71 = (ushort)(sVar48 < sVar53) * sVar48 | (ushort)(sVar48 >= sVar53) * sVar53;
      uVar74 = (ushort)(sVar49 < sVar73) * sVar49 | (ushort)(sVar49 >= sVar73) * sVar73;
      auVar56._0_8_ =
           CONCAT26((-1 < (short)uVar67) * uVar67,
                    CONCAT24((-1 < (short)uVar65) * uVar65,
                             CONCAT22((-1 < (short)uVar64) * uVar64,(-1 < (short)uVar52) * uVar52)))
      ;
      auVar56._8_2_ = (-1 < (short)uVar68) * uVar68;
      auVar56._10_2_ = (-1 < (short)uVar70) * uVar70;
      auVar56._12_2_ = (-1 < (short)uVar71) * uVar71;
      auVar56._14_2_ = (-1 < (short)uVar74) * uVar74;
      *puVar31 = auVar56._0_8_;
      puVar31 = (undefined8 *)((long)puVar31 + (long)stride * 2);
      piVar30 = (int *)((long)piVar30 + ((ulong)(((byte)((byte)uVar32 | bVar39) & 1) << 5) - 0x10));
      uVar37 = uVar37 - 1;
    } while (uVar37 != 0);
    break;
  case 6:
    iVar79 = txfm_param->bd;
    bVar3 = txfm_param->tx_type;
    uVar29 = (ulong)bVar3;
    bVar39 = 0xf < uVar29;
    pauVar21 = (undefined1 (*) [16])((long)dest * 2);
    pcVar6 = av1_inv_txfm_shift_ls[uVar24];
    uVar34 = (ulong)(uint)tx_size_wide[bVar2];
    lVar28 = (long)tx_size_high[bVar2];
    pcVar7 = *(code **)((ulong)""[uVar29] * 0x20 + (long)tx_size_wide_log2[bVar2] * 0x60 + 0x5da8a8)
    ;
    pcVar8 = *(code **)((ulong)""[uVar29] * 0x20 + (long)tx_size_high_log2[bVar2] * 0x60 + 0x5da8a0)
    ;
    uVar27 = 0xbeaf >> (bVar3 & 0x1f);
    pauVar23 = (undefined1 (*) [16])&local_238;
    memcpy(pauVar23,input,uVar34 * 0x10);
    auVar59 = pmovsxwd(extraout_XMM0,0xb500b500b500b50);
    auVar76 = pmovsxwd(in_XMM1,0x800080008000800);
    uVar24 = uVar34;
    do {
      auVar55 = pmulld(*pauVar23,auVar59);
      *(int *)*pauVar23 = auVar55._0_4_ + auVar76._0_4_ >> 0xc;
      *(int *)((long)*pauVar23 + 4) = auVar55._4_4_ + auVar76._4_4_ >> 0xc;
      *(int *)((long)*pauVar23 + 8) = auVar55._8_4_ + auVar76._8_4_ >> 0xc;
      *(int *)((long)*pauVar23 + 0xc) = auVar55._12_4_ + auVar76._12_4_ >> 0xc;
      pauVar23 = pauVar23 + 1;
      uVar24 = uVar24 - 1;
    } while (uVar24 != 0);
    pauVar23 = (undefined1 (*) [16])&local_238;
    (*pcVar7)(pauVar23,pauVar23,0xc,0,iVar79,-(int)*pcVar6);
    pauVar36 = pauVar23;
    if ((0x7f1fU >> (bVar3 & 0x1f) & 1) == 0 && !bVar39) {
      uVar24 = uVar34;
      pauVar35 = (undefined1 (*) [16])local_138 + uVar34;
      do {
        uVar12 = *(undefined8 *)(*pauVar23 + 8);
        *(undefined8 *)pauVar35[-1] = *(undefined8 *)*pauVar23;
        *(undefined8 *)(pauVar35[-1] + 8) = uVar12;
        pauVar23 = pauVar23 + 1;
        uVar24 = uVar24 - 1;
        pauVar36 = (undefined1 (*) [16])local_138;
        pauVar35 = pauVar35 + -1;
      } while (uVar24 != 0);
    }
    lVar38 = 1;
    pauVar23 = pauVar36;
    do {
      auVar59 = *pauVar23;
      uVar9 = *(undefined4 *)(pauVar23[2] + 4);
      uVar10 = *(undefined4 *)(pauVar23[2] + 8);
      uVar11 = *(undefined4 *)(pauVar23[2] + 0xc);
      auVar76 = pauVar23[3];
      auVar83._0_8_ = auVar59._0_8_;
      auVar83._8_4_ = auVar59._4_4_;
      auVar83._12_4_ = *(undefined4 *)(pauVar23[1] + 4);
      auVar42._0_8_ = CONCAT44(*(undefined4 *)(pauVar23[1] + 8),auVar59._8_4_);
      auVar42._8_4_ = auVar59._12_4_;
      auVar42._12_4_ = *(undefined4 *)(pauVar23[1] + 0xc);
      *(ulong *)*pauVar23 = CONCAT44(*(undefined4 *)pauVar23[1],auVar59._0_4_);
      *(ulong *)(*pauVar23 + 8) = CONCAT44(auVar76._0_4_,*(undefined4 *)pauVar23[2]);
      *(long *)pauVar23[1] = auVar83._8_8_;
      *(undefined4 *)pauVar23[2] = uVar9;
      *(int *)(pauVar23[2] + 4) = auVar76._4_4_;
      *(undefined8 *)pauVar23[2] = auVar42._0_8_;
      *(undefined4 *)(pauVar23[2] + 8) = uVar10;
      *(int *)(pauVar23[2] + 0xc) = auVar76._8_4_;
      *(long *)pauVar23[3] = auVar42._8_8_;
      *(undefined4 *)pauVar23[4] = uVar11;
      *(int *)(pauVar23[4] + 4) = auVar76._12_4_;
      (*pcVar8)(pauVar23,pauVar23,0xc,1,iVar79,0);
      pauVar23 = pauVar23 + lVar28;
      lVar38 = lVar38 + -1;
    } while (lVar38 == 0);
    bVar2 = pcVar6[1];
    pauVar23 = pauVar36;
    if ((char)bVar2 < '\0') {
      iVar81 = 1 << (~bVar2 & 0x1f);
      auVar59 = ZEXT416((uint)-(int)(char)bVar2);
      do {
        iVar80 = *(int *)(*pauVar23 + 4);
        iVar82 = *(int *)(*pauVar23 + 8);
        iVar75 = *(int *)(*pauVar23 + 0xc);
        *(int *)*pauVar23 = *(int *)*pauVar23 + iVar81 >> auVar59;
        *(int *)(*pauVar23 + 4) = iVar80 + iVar81 >> auVar59;
        *(int *)(*pauVar23 + 8) = iVar82 + iVar81 >> auVar59;
        *(int *)(*pauVar23 + 0xc) = iVar75 + iVar81 >> auVar59;
        pauVar23 = pauVar23 + 1;
        uVar34 = uVar34 - 1;
      } while (uVar34 != 0);
    }
    else {
      do {
        uVar9 = *(undefined4 *)(*pauVar23 + 4);
        uVar10 = *(undefined4 *)(*pauVar23 + 8);
        uVar11 = *(undefined4 *)(*pauVar23 + 0xc);
        *(int *)*pauVar23 = *(int *)*pauVar23 << (int)(char)bVar2;
        *(undefined4 *)(*pauVar23 + 4) = uVar9;
        *(undefined4 *)(*pauVar23 + 8) = uVar10;
        *(undefined4 *)(*pauVar23 + 0xc) = uVar11;
        uVar34 = uVar34 - 1;
        pauVar23 = pauVar23 + 1;
      } while (uVar34 != 0);
    }
    uVar26 = ~(-1 << ((byte)iVar79 & 0x1f));
    lVar38 = 0;
    if ((uVar27 & 1) == 0 && !bVar39) {
      lVar38 = lVar28 + -1;
    }
    pauVar36 = pauVar36 + lVar38;
    lVar38 = lVar28;
    do {
      auVar59 = *pauVar21;
      auVar76 = pmovsxwd(auVar76,auVar59);
      auVar61._8_4_ = auVar59._8_4_;
      auVar61._12_4_ = auVar59._12_4_;
      auVar61._0_8_ = auVar59._8_8_;
      iVar82 = auVar76._0_4_ + *(int *)*pauVar36;
      iVar80 = auVar76._4_4_ + *(int *)(*pauVar36 + 4);
      iVar81 = auVar76._8_4_ + *(int *)(*pauVar36 + 8);
      iVar79 = auVar76._12_4_ + *(int *)(*pauVar36 + 0xc);
      auVar59 = pmovsxwd(auVar61,auVar61);
      pauVar23 = pauVar36 + lVar28;
      iVar75 = auVar59._0_4_ + *(int *)*pauVar23;
      iVar54 = auVar59._4_4_ + *(int *)(*pauVar23 + 4);
      iVar66 = auVar59._8_4_ + *(int *)(*pauVar23 + 8);
      iVar69 = auVar59._12_4_ + *(int *)(*pauVar23 + 0xc);
      iVar82 = (uint)(-1 < iVar82) * iVar82;
      iVar80 = (uint)(-1 < iVar80) * iVar80;
      iVar81 = (uint)(-1 < iVar81) * iVar81;
      iVar79 = (uint)(-1 < iVar79) * iVar79;
      auVar78._0_4_ = ((int)uVar26 < iVar82) * uVar26 | (uint)((int)uVar26 >= iVar82) * iVar82;
      auVar78._4_4_ = ((int)uVar26 < iVar80) * uVar26 | (uint)((int)uVar26 >= iVar80) * iVar80;
      auVar78._8_4_ = ((int)uVar26 < iVar81) * uVar26 | (uint)((int)uVar26 >= iVar81) * iVar81;
      auVar78._12_4_ = ((int)uVar26 < iVar79) * uVar26 | (uint)((int)uVar26 >= iVar79) * iVar79;
      iVar75 = (uint)(-1 < iVar75) * iVar75;
      iVar54 = (uint)(-1 < iVar54) * iVar54;
      iVar66 = (uint)(-1 < iVar66) * iVar66;
      iVar69 = (uint)(-1 < iVar69) * iVar69;
      auVar62._0_4_ = ((int)uVar26 < iVar75) * uVar26 | (uint)((int)uVar26 >= iVar75) * iVar75;
      auVar62._4_4_ = ((int)uVar26 < iVar54) * uVar26 | (uint)((int)uVar26 >= iVar54) * iVar54;
      auVar62._8_4_ = ((int)uVar26 < iVar66) * uVar26 | (uint)((int)uVar26 >= iVar66) * iVar66;
      auVar62._12_4_ = ((int)uVar26 < iVar69) * uVar26 | (uint)((int)uVar26 >= iVar69) * iVar69;
      auVar76 = packusdw(auVar78,auVar62);
      *pauVar21 = auVar76;
      pauVar21 = (undefined1 (*) [16])(*pauVar21 + (long)stride * 2);
      pauVar36 = (undefined1 (*) [16])(pauVar36[-1] + (((byte)((byte)uVar27 | bVar39) & 1) << 5));
      lVar38 = lVar38 + -1;
    } while (lVar38 != 0);
    break;
  case 0xd:
    uVar27 = txfm_param->bd;
    bVar3 = txfm_param->tx_type;
    uVar29 = (ulong)bVar3;
    bVar39 = 0xf < uVar29;
    pcVar6 = av1_inv_txfm_shift_ls[uVar24];
    uVar24 = (ulong)((uint)bVar2 * 4);
    uVar26 = *(uint *)((long)tx_size_high + uVar24);
    uVar34 = (ulong)uVar26;
    pcVar7 = *(code **)((ulong)""[uVar29] * 0x20 +
                       (long)*(int *)((long)tx_size_high_log2 + uVar24) * 0x60 + 0x5da8b0);
    uVar33 = 0xbeaf >> (bVar3 & 0x1f);
    uVar32 = (int)uVar26 >> 2;
    if (0 < (int)uVar32) {
      uVar5 = *(uint *)((long)tx_size_wide + uVar24);
      pcVar8 = *(code **)((ulong)""[uVar29] * 0x20 +
                         (long)*(int *)((long)tx_size_wide_log2 + uVar24) * 0x60 + 0x5da8a0);
      uVar20 = 0x20;
      if ((int)uVar26 < 0x20) {
        uVar20 = uVar26;
      }
      puVar31 = &local_238;
      uVar24 = 0;
      do {
        ptVar22 = input;
        puVar25 = puVar31;
        uVar29 = (ulong)uVar5;
        do {
          uVar12 = *(undefined8 *)(ptVar22 + 2);
          *puVar25 = *(undefined8 *)ptVar22;
          puVar25[1] = uVar12;
          puVar25 = puVar25 + 2;
          ptVar22 = ptVar22 + (int)uVar20;
          uVar29 = uVar29 - 1;
        } while (uVar29 != 0);
        (*pcVar8)(&local_238 + uVar24 * 8,&local_238 + uVar24 * 8,0xc,0,uVar27,-(int)*pcVar6);
        uVar24 = uVar24 + 1;
        puVar31 = puVar31 + 8;
        input = input + 4;
      } while (uVar24 != uVar32);
    }
    if ((0x7f1fU >> (bVar3 & 0x1f) & 1) == 0 && !bVar39) {
      if (0 < (int)uVar32) {
        lVar28 = 0;
        do {
          uVar9 = *(undefined4 *)((long)local_228 + lVar28 + -8);
          uVar10 = *(undefined4 *)((long)local_228 + lVar28 + -4);
          auVar59 = *(undefined1 (*) [16])((long)local_228 + lVar28);
          uVar11 = *(undefined4 *)((long)local_228 + lVar28 + 0x14);
          uVar13 = *(undefined4 *)((long)local_228 + lVar28 + 0x18);
          uVar14 = *(undefined4 *)((long)local_228 + lVar28 + 0x1c);
          uVar15 = *(undefined4 *)((long)local_228 + lVar28 + 0x24);
          uVar16 = *(undefined4 *)((long)local_228 + lVar28 + 0x28);
          uVar17 = *(undefined4 *)(local_1f8 + lVar28 + -4);
          auVar57._0_8_ = auVar59._0_8_;
          auVar57._8_4_ = auVar59._4_4_;
          auVar57._12_4_ = *(undefined4 *)((long)&local_238 + lVar28 + 4);
          in_XMM2._8_8_ = auVar57._8_8_;
          in_XMM2._0_8_ = CONCAT44(*(undefined4 *)((long)&local_238 + lVar28),auVar59._0_4_);
          *(ulong *)((long)local_138 + lVar28) =
               CONCAT44(*(undefined4 *)((long)local_228 + lVar28 + 0x10),
                        *(undefined4 *)((long)local_228 + lVar28 + 0x20));
          *(undefined8 *)((long)&uStack_130 + lVar28) = in_XMM2._0_8_;
          *(undefined4 *)((long)&uStack_120 + lVar28) = uVar15;
          *(undefined4 *)((long)local_118 + lVar28 + -4) = uVar11;
          *(undefined8 *)((long)&uStack_120 + lVar28) = in_XMM2._8_8_;
          *(undefined4 *)((long)local_118 + lVar28) = uVar16;
          *(undefined4 *)((long)local_118 + lVar28 + 4) = uVar13;
          *(int *)((long)&uStack_110 + lVar28) = auVar59._8_4_;
          *(undefined4 *)((long)&uStack_110 + lVar28 + 4) = uVar9;
          *(undefined4 *)((long)&uStack_100 + lVar28) = uVar17;
          *(undefined4 *)((long)local_f8 + lVar28 + -4) = uVar14;
          *(int *)((long)local_f8 + lVar28) = auVar59._12_4_;
          *(undefined4 *)((long)local_f8 + lVar28 + 4) = uVar10;
          lVar28 = lVar28 + 0x40;
        } while ((ulong)uVar32 << 6 != lVar28);
      }
    }
    else if (0 < (int)uVar32) {
      lVar28 = 0;
      do {
        uVar15 = *(undefined4 *)((long)&local_238 + lVar28 + 4);
        uVar16 = *(undefined4 *)((long)local_228 + lVar28 + -8);
        uVar17 = *(undefined4 *)((long)local_228 + lVar28 + -4);
        uVar9 = *(undefined4 *)((long)local_228 + lVar28 + 4);
        uVar10 = *(undefined4 *)((long)local_228 + lVar28 + 8);
        uVar11 = *(undefined4 *)((long)local_228 + lVar28 + 0xc);
        uVar18 = *(undefined4 *)((long)local_228 + lVar28 + 0x10);
        uVar19 = *(undefined4 *)((long)local_228 + lVar28 + 0x14);
        uVar13 = *(undefined4 *)((long)local_228 + lVar28 + 0x20);
        uVar14 = *(undefined4 *)((long)local_228 + lVar28 + 0x24);
        in_XMM2._0_8_ =
             CONCAT44(*(undefined4 *)((long)local_228 + lVar28 + 0x28),
                      *(undefined4 *)((long)local_228 + lVar28 + 0x18));
        in_XMM2._8_4_ = *(undefined4 *)((long)local_228 + lVar28 + 0x1c);
        in_XMM2._12_4_ = *(undefined4 *)(local_1f8 + lVar28 + -4);
        *(ulong *)((long)local_138 + lVar28) =
             CONCAT44(*(undefined4 *)((long)local_228 + lVar28),
                      *(undefined4 *)((long)&local_238 + lVar28));
        *(ulong *)((long)&uStack_130 + lVar28) = CONCAT44(uVar13,uVar18);
        *(undefined4 *)((long)&uStack_120 + lVar28) = uVar15;
        *(undefined4 *)((long)local_118 + lVar28 + -4) = uVar9;
        *(undefined4 *)((long)local_118 + lVar28) = uVar19;
        *(undefined4 *)((long)local_118 + lVar28 + 4) = uVar14;
        *(undefined4 *)((long)local_118 + lVar28) = uVar16;
        *(undefined4 *)((long)local_118 + lVar28 + 4) = uVar10;
        *(undefined8 *)((long)&uStack_110 + lVar28) = in_XMM2._0_8_;
        *(undefined4 *)((long)&uStack_100 + lVar28) = uVar17;
        *(undefined4 *)((long)local_f8 + lVar28 + -4) = uVar11;
        *(long *)((long)&uStack_100 + lVar28) = in_XMM2._8_8_;
        lVar28 = lVar28 + 0x40;
      } while ((ulong)uVar32 << 6 != lVar28);
    }
    puVar31 = (undefined8 *)((long)dest * 2);
    lVar28 = (long)(int)uVar26;
    local_250 = (byte)uVar33;
    pauVar23 = (undefined1 (*) [16])local_138;
    (*pcVar7)(pauVar23,pauVar23,0xc,1,uVar27,0);
    bVar2 = pcVar6[1];
    if ((char)bVar2 < '\0') {
      iVar79 = 1 << (~bVar2 & 0x1f);
      pauVar23 = (undefined1 (*) [16])local_138;
      auVar51 = ZEXT416((uint)-(int)(char)bVar2);
      do {
        in_XMM2._0_4_ = *(int *)*pauVar23 + iVar79 >> auVar51;
        in_XMM2._4_4_ = *(int *)((long)*pauVar23 + 4) + iVar79 >> auVar51;
        in_XMM2._8_4_ = *(int *)((long)*pauVar23 + 8) + iVar79 >> auVar51;
        in_XMM2._12_4_ = *(int *)((long)*pauVar23 + 0xc) + iVar79 >> auVar51;
        *pauVar23 = in_XMM2;
        pauVar23 = pauVar23 + 1;
        uVar34 = uVar34 - 1;
      } while (uVar34 != 0);
    }
    else {
      do {
        auVar51._0_4_ = *(int *)*pauVar23 << (int)(char)bVar2;
        auVar51._4_4_ = *(int *)((long)*pauVar23 + 4);
        auVar51._8_4_ = *(int *)((long)*pauVar23 + 8);
        auVar51._12_4_ = *(int *)((long)*pauVar23 + 0xc);
        *pauVar23 = auVar51;
        pauVar23 = pauVar23 + 1;
        uVar34 = uVar34 - 1;
      } while (uVar34 != 0);
    }
    auVar59 = pmovsxbw(auVar51,0x101010101010101);
    auVar59 = psllw(auVar59,ZEXT416(uVar27));
    sVar40 = auVar59._0_2_ + -1;
    sVar43 = auVar59._2_2_ + -1;
    sVar44 = auVar59._4_2_ + -1;
    sVar45 = auVar59._6_2_ + -1;
    sVar46 = auVar59._8_2_ + -1;
    sVar47 = auVar59._10_2_ + -1;
    sVar48 = auVar59._12_2_ + -1;
    sVar49 = auVar59._14_2_ + -1;
    lVar38 = 0;
    if (!bVar39 && (uVar33 & 1) == 0) {
      lVar38 = lVar28 + -1;
    }
    piVar30 = local_138 + lVar38 * 4;
    do {
      auVar59 = pmovsxwd(in_XMM2,*puVar31);
      auVar63._0_4_ = auVar59._0_4_ + *piVar30;
      auVar63._4_4_ = auVar59._4_4_ + piVar30[1];
      auVar63._8_4_ = auVar59._8_4_ + piVar30[2];
      auVar63._12_4_ = auVar59._12_4_ + piVar30[3];
      auVar59 = packusdw(auVar63,auVar63);
      sVar53 = auVar59._0_2_;
      uVar52 = (ushort)(sVar40 < sVar53) * sVar40 | (ushort)(sVar40 >= sVar53) * sVar53;
      sVar53 = auVar59._2_2_;
      uVar64 = (ushort)(sVar43 < sVar53) * sVar43 | (ushort)(sVar43 >= sVar53) * sVar53;
      sVar53 = auVar59._4_2_;
      uVar65 = (ushort)(sVar44 < sVar53) * sVar44 | (ushort)(sVar44 >= sVar53) * sVar53;
      sVar53 = auVar59._6_2_;
      uVar67 = (ushort)(sVar45 < sVar53) * sVar45 | (ushort)(sVar45 >= sVar53) * sVar53;
      sVar53 = auVar59._8_2_;
      uVar68 = (ushort)(sVar46 < sVar53) * sVar46 | (ushort)(sVar46 >= sVar53) * sVar53;
      sVar53 = auVar59._10_2_;
      uVar70 = (ushort)(sVar47 < sVar53) * sVar47 | (ushort)(sVar47 >= sVar53) * sVar53;
      sVar53 = auVar59._12_2_;
      sVar73 = auVar59._14_2_;
      uVar71 = (ushort)(sVar48 < sVar53) * sVar48 | (ushort)(sVar48 >= sVar53) * sVar53;
      uVar74 = (ushort)(sVar49 < sVar73) * sVar49 | (ushort)(sVar49 >= sVar73) * sVar73;
      in_XMM2._0_8_ =
           CONCAT26((-1 < (short)uVar67) * uVar67,
                    CONCAT24((-1 < (short)uVar65) * uVar65,
                             CONCAT22((-1 < (short)uVar64) * uVar64,(-1 < (short)uVar52) * uVar52)))
      ;
      in_XMM2._8_2_ = (-1 < (short)uVar68) * uVar68;
      in_XMM2._10_2_ = (-1 < (short)uVar70) * uVar70;
      in_XMM2._12_2_ = (-1 < (short)uVar71) * uVar71;
      in_XMM2._14_2_ = (-1 < (short)uVar74) * uVar74;
      *puVar31 = in_XMM2._0_8_;
      puVar31 = (undefined8 *)((long)puVar31 + (long)stride * 2);
      piVar30 = (int *)((long)piVar30 + ((ulong)(((bVar39 | local_250) & 1) << 5) - 0x10));
      lVar28 = lVar28 + -1;
    } while (lVar28 != 0);
    break;
  case 0xe:
    iVar79 = txfm_param->bd;
    bVar3 = txfm_param->tx_type;
    uVar29 = (ulong)bVar3;
    bVar39 = 0xf < uVar29;
    pcVar6 = av1_inv_txfm_shift_ls[uVar24];
    iVar81 = tx_size_wide_log2[bVar2];
    uVar27 = tx_size_wide[bVar2];
    uVar24 = (ulong)uVar27;
    iVar80 = tx_size_high[bVar2];
    lVar28 = (long)iVar80;
    bVar4 = ""[uVar29];
    uVar26 = 0xbeaf >> (bVar3 & 0x1f);
    pcVar7 = *(code **)((ulong)""[uVar29] * 0x20 + (long)tx_size_high_log2[bVar2] * 0x60 + 0x5da8a0)
    ;
    pauVar23 = (undefined1 (*) [16])&local_238;
    memcpy(pauVar23,input,uVar24 * 0x10);
    (**(code **)((ulong)bVar4 * 0x20 + (long)iVar81 * 0x60 + 0x5da8b0))
              (pauVar23,pauVar23,0xc,0,iVar79,-(int)*pcVar6);
    pauVar21 = pauVar23;
    if ((0x7f1fU >> (bVar3 & 0x1f) & 1) == 0 && !bVar39) {
      uVar29 = uVar24;
      pauVar36 = (undefined1 (*) [16])local_138 + uVar24;
      do {
        uVar12 = *(undefined8 *)((long)*pauVar23 + 8);
        *(undefined8 *)pauVar36[-1] = *(undefined8 *)*pauVar23;
        *(undefined8 *)(pauVar36[-1] + 8) = uVar12;
        pauVar23 = pauVar23 + 1;
        uVar29 = uVar29 - 1;
        pauVar21 = (undefined1 (*) [16])local_138;
        pauVar36 = pauVar36 + -1;
      } while (uVar29 != 0);
    }
    if (0 < (int)uVar27 >> 2) {
      uVar29 = (ulong)(uint)((int)uVar27 >> 2);
      pauVar23 = pauVar21;
      do {
        auVar59 = *pauVar23;
        uVar9 = *(undefined4 *)(pauVar23[2] + 4);
        uVar10 = *(undefined4 *)(pauVar23[2] + 8);
        uVar11 = *(undefined4 *)(pauVar23[2] + 0xc);
        in_XMM3 = pauVar23[3];
        auVar55._0_8_ = auVar59._0_8_;
        auVar55._8_4_ = auVar59._4_4_;
        auVar55._12_4_ = *(undefined4 *)(pauVar23[1] + 4);
        auVar76._0_8_ = CONCAT44(*(undefined4 *)(pauVar23[1] + 8),auVar59._8_4_);
        auVar76._8_4_ = auVar59._12_4_;
        auVar76._12_4_ = *(undefined4 *)(pauVar23[1] + 0xc);
        *(ulong *)*pauVar23 = CONCAT44(*(undefined4 *)pauVar23[1],auVar59._0_4_);
        *(ulong *)((long)*pauVar23 + 8) = CONCAT44(in_XMM3._0_4_,*(undefined4 *)pauVar23[2]);
        *(long *)pauVar23[1] = auVar55._8_8_;
        *(undefined4 *)pauVar23[2] = uVar9;
        *(int *)(pauVar23[2] + 4) = in_XMM3._4_4_;
        *(undefined8 *)pauVar23[2] = auVar76._0_8_;
        *(undefined4 *)(pauVar23[2] + 8) = uVar10;
        *(int *)(pauVar23[2] + 0xc) = in_XMM3._8_4_;
        *(long *)pauVar23[3] = auVar76._8_8_;
        *(undefined4 *)pauVar23[4] = uVar11;
        *(int *)(pauVar23[4] + 4) = in_XMM3._12_4_;
        (*pcVar7)(pauVar23,pauVar23,0xc,1,iVar79,0);
        pauVar23 = pauVar23 + lVar28;
        uVar29 = uVar29 - 1;
      } while (uVar29 != 0);
    }
    bVar2 = pcVar6[1];
    pauVar23 = pauVar21;
    if ((char)bVar2 < '\0') {
      iVar81 = 1 << (~bVar2 & 0x1f);
      auVar59 = ZEXT416((uint)-(int)(char)bVar2);
      do {
        iVar82 = *(int *)((long)*pauVar23 + 4);
        iVar75 = *(int *)((long)*pauVar23 + 8);
        iVar69 = *(int *)((long)*pauVar23 + 0xc);
        *(int *)*pauVar23 = *(int *)*pauVar23 + iVar81 >> auVar59;
        *(int *)((long)*pauVar23 + 4) = iVar82 + iVar81 >> auVar59;
        *(int *)((long)*pauVar23 + 8) = iVar75 + iVar81 >> auVar59;
        *(int *)((long)*pauVar23 + 0xc) = iVar69 + iVar81 >> auVar59;
        pauVar23 = pauVar23 + 1;
        uVar24 = uVar24 - 1;
      } while (uVar24 != 0);
    }
    else {
      do {
        uVar9 = *(undefined4 *)((long)*pauVar23 + 4);
        uVar10 = *(undefined4 *)((long)*pauVar23 + 8);
        uVar11 = *(undefined4 *)((long)*pauVar23 + 0xc);
        *(int *)*pauVar23 = *(int *)*pauVar23 << (int)(char)bVar2;
        *(undefined4 *)((long)*pauVar23 + 4) = uVar9;
        *(undefined4 *)((long)*pauVar23 + 8) = uVar10;
        *(undefined4 *)((long)*pauVar23 + 0xc) = uVar11;
        uVar24 = uVar24 - 1;
        pauVar23 = pauVar23 + 1;
      } while (uVar24 != 0);
    }
    if (0 < (int)uVar27 >> 3) {
      pauVar23 = (undefined1 (*) [16])((long)dest * 2);
      local_248 = (byte)uVar26;
      uVar33 = ~(-1 << ((byte)iVar79 & 0x1f));
      uVar29 = 0;
      uVar24 = lVar28 - 1;
      if (bVar39 || (uVar26 & 1) != 0) {
        uVar24 = uVar29;
      }
      uVar34 = 0;
      do {
        pauVar35 = pauVar21 + uVar24 + (long)(int)uVar29;
        pauVar36 = pauVar23;
        lVar38 = lVar28;
        do {
          auVar59 = *pauVar36;
          auVar76 = pmovsxwd(in_XMM3,auVar59);
          auVar59._0_8_ = auVar59._8_8_;
          iVar75 = auVar76._0_4_ + *(int *)*pauVar35;
          iVar79 = auVar76._4_4_ + *(int *)((long)*pauVar35 + 4);
          iVar81 = auVar76._8_4_ + *(int *)((long)*pauVar35 + 8);
          iVar82 = auVar76._12_4_ + *(int *)((long)*pauVar35 + 0xc);
          auVar59 = pmovsxwd(auVar59,auVar59);
          pauVar1 = pauVar35 + lVar28;
          iVar54 = auVar59._0_4_ + *(int *)*pauVar1;
          iVar66 = auVar59._4_4_ + *(int *)((long)*pauVar1 + 4);
          iVar69 = auVar59._8_4_ + *(int *)((long)*pauVar1 + 8);
          iVar72 = auVar59._12_4_ + *(int *)((long)*pauVar1 + 0xc);
          iVar75 = (uint)(-1 < iVar75) * iVar75;
          iVar79 = (uint)(-1 < iVar79) * iVar79;
          iVar81 = (uint)(-1 < iVar81) * iVar81;
          iVar82 = (uint)(-1 < iVar82) * iVar82;
          auVar77._0_4_ = ((int)uVar33 < iVar75) * uVar33 | (uint)((int)uVar33 >= iVar75) * iVar75;
          auVar77._4_4_ = ((int)uVar33 < iVar79) * uVar33 | (uint)((int)uVar33 >= iVar79) * iVar79;
          auVar77._8_4_ = ((int)uVar33 < iVar81) * uVar33 | (uint)((int)uVar33 >= iVar81) * iVar81;
          auVar77._12_4_ = ((int)uVar33 < iVar82) * uVar33 | (uint)((int)uVar33 >= iVar82) * iVar82;
          iVar54 = (uint)(-1 < iVar54) * iVar54;
          iVar66 = (uint)(-1 < iVar66) * iVar66;
          iVar69 = (uint)(-1 < iVar69) * iVar69;
          iVar72 = (uint)(-1 < iVar72) * iVar72;
          auVar60._0_4_ = ((int)uVar33 < iVar54) * uVar33 | (uint)((int)uVar33 >= iVar54) * iVar54;
          auVar60._4_4_ = ((int)uVar33 < iVar66) * uVar33 | (uint)((int)uVar33 >= iVar66) * iVar66;
          auVar60._8_4_ = ((int)uVar33 < iVar69) * uVar33 | (uint)((int)uVar33 >= iVar69) * iVar69;
          auVar60._12_4_ = ((int)uVar33 < iVar72) * uVar33 | (uint)((int)uVar33 >= iVar72) * iVar72;
          in_XMM3 = packusdw(auVar77,auVar60);
          *pauVar36 = in_XMM3;
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + (long)stride * 2);
          pauVar35 = (undefined1 (*) [16])(pauVar35[-1] + (((bVar39 | local_248) & 1) << 5));
          lVar38 = lVar38 + -1;
        } while (lVar38 != 0);
        uVar34 = uVar34 + 1;
        pauVar23 = pauVar23 + 1;
        uVar29 = (ulong)(uint)((int)uVar29 + iVar80 * 2);
      } while (uVar34 != (uint)((int)uVar27 >> 3));
    }
  }
  return;
}

Assistant:

void av1_highbd_inv_txfm_add_sse4_1(const tran_low_t *input, uint8_t *dest,
                                    int stride, const TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_8X8:
      av1_highbd_inv_txfm_add_8x8_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X8:
      av1_highbd_inv_txfm_add_4x8_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_8X4:
      av1_highbd_inv_txfm_add_8x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X4:
      av1_highbd_inv_txfm_add_4x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_16X4:
      av1_highbd_inv_txfm_add_16x4_sse4_1(input, dest, stride, txfm_param);
      break;
    case TX_4X16:
      av1_highbd_inv_txfm_add_4x16_sse4_1(input, dest, stride, txfm_param);
      break;
    default:
      av1_highbd_inv_txfm2d_add_universe_sse4_1(
          input, dest, stride, txfm_param->tx_type, tx_size, txfm_param->eob,
          txfm_param->bd);
      break;
  }
}